

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::chooseColumn_slice(HDual *this,HVector *row_ep)

{
  HDualRow *this_00;
  double dVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  ulong uVar4;
  undefined4 uVar5;
  HMatrix *this_01;
  HDualRow *this_02;
  HVector *this_03;
  HDualRow *otherRow;
  int i;
  long lVar6;
  undefined1 auVar7 [16];
  
  if (this->invertHint != 0) {
    return;
  }
  uVar2 = rdtsc();
  uVar5 = (undefined4)((ulong)uVar2 >> 0x20);
  auVar3._4_4_ = uVar5;
  auVar3._0_4_ = uVar5;
  auVar3._8_4_ = 0;
  auVar7._0_12_ = auVar3 << 0x20;
  auVar7._12_4_ = 0x45300000;
  (this->model->timer).itemStart[0xc] =
       (auVar7._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
  this_00 = &this->dualRow;
  HDualRow::clear(this_00);
  (this->dualRow).workDelta = this->deltaPrimal;
  HDualRow::create_Freemove(this_00,row_ep);
  HDualRow::choose_makepack(this_00,row_ep,this->numCol);
  HDualRow::choose_possible(this_00);
  this_03 = this->slice_row_ap;
  this_01 = this->slice_matrix;
  otherRow = this->slice_dualRow;
  this_02 = otherRow;
  for (lVar6 = 0; uVar4 = (ulong)this->slice_num, lVar6 < (long)uVar4; lVar6 = lVar6 + 1) {
    HVector::clear(this_03);
    HMatrix::price_by_row(this_01,this_03,row_ep);
    HDualRow::clear(this_02);
    this_02->workDelta = this->deltaPrimal;
    HDualRow::choose_makepack(this_02,this_03,this->slice_start[lVar6]);
    HDualRow::choose_possible(this_02);
    this_02 = this_02 + 1;
    this_01 = this_01 + 1;
    this_03 = this_03 + 1;
  }
  for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
    HDualRow::choose_joinpack(this_00,otherRow);
    uVar4 = (ulong)(uint)this->slice_num;
    otherRow = otherRow + 1;
  }
  this->columnIn = -1;
  if (((this->dualRow).workTheta <= 0.0) || ((this->dualRow).workCount == 0)) {
    this->invertHint = 5;
  }
  else {
    HTimer::recordFinish(&this->model->timer,0xc);
    HDualRow::choose_final(this_00);
    HDualRow::delete_Freemove(this_00);
    this->columnIn = (this->dualRow).workPivot;
    dVar1 = (this->dualRow).workTheta;
    this->alphaRow = (this->dualRow).workAlpha;
    this->thetaDual = dVar1;
  }
  return;
}

Assistant:

void HDual::chooseColumn_slice(HVector *row_ep) {
	if (invertHint)
		return;

	model->timer.recordStart(HTICK_CHUZC1);
	dualRow.clear();
	dualRow.workDelta = deltaPrimal;
	dualRow.create_Freemove(row_ep);

	// Row_ep:         PACK + CC1
#pragma omp task
	{

		dualRow.choose_makepack(row_ep, numCol);
		dualRow.choose_possible();
	}

	// Row_ap: PRICE + PACK + CC1
	for (int i = 0; i < slice_num; i++) {
#pragma omp task
		{
			slice_row_ap[i].clear();
			slice_matrix[i].price_by_row(slice_row_ap[i], *row_ep);

			slice_dualRow[i].clear();
			slice_dualRow[i].workDelta = deltaPrimal;
			slice_dualRow[i].choose_makepack(&slice_row_ap[i], slice_start[i]);
			slice_dualRow[i].choose_possible();
		}
	}
#pragma omp taskwait

	// Join CC1 results here
	for (int i = 0; i < slice_num; i++)
		dualRow.choose_joinpack(&slice_dualRow[i]);

	// Infeasible we created before
	columnIn = -1;
	if (dualRow.workTheta <= 0 || dualRow.workCount == 0) {
   	  invertHint = invertHint_possiblyDualUnbounded; // Was 1
		return;
	}
	model->timer.recordFinish(HTICK_CHUZC1);

	// Choose column 2, This only happens if didn't go out
	dualRow.choose_final();
	dualRow.delete_Freemove();
	columnIn = dualRow.workPivot;
	alphaRow = dualRow.workAlpha;
	thetaDual = dualRow.workTheta;
}